

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

void __thiscall vox::DICT::Add(DICT *this,string *vKey,string *vValue)

{
  pointer pcVar1;
  string local_b0;
  string local_90;
  DICTitem local_70;
  
  pcVar1 = (vKey->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + vKey->_M_string_length);
  pcVar1 = (vValue->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + vValue->_M_string_length);
  DICTitem::DICTitem(&local_70,&local_90,&local_b0);
  std::vector<vox::DICTitem,_std::allocator<vox::DICTitem>_>::emplace_back<vox::DICTitem>
            (&this->keys,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value.buffer._M_dataplus._M_p != &local_70.value.buffer.field_2) {
    operator_delete(local_70.value.buffer._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.key.buffer._M_dataplus._M_p != &local_70.key.buffer.field_2) {
    operator_delete(local_70.key.buffer._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DICT::Add(std::string vKey, std::string vValue) { keys.push_back(DICTitem(vKey, vValue)); }